

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionPrivate::_q_hostLookupFinished
          (QHttpNetworkConnectionPrivate *this,QHostInfo *info)

{
  QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
  *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  NetworkLayerProtocol NVar5;
  Capabilities CVar6;
  Capabilities CVar7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  NetworkError errorCode;
  QHostAddress *address;
  QHostAddress *this_00;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  long in_FS_OFFSET;
  QArrayDataPointer<QHostAddress> local_78;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->networkLayerState - IPv4 < 3) goto LAB_0020223c;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QHostAddress *)&DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::addresses((QList<QHostAddress> *)&local_78,info);
  if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
LAB_002020eb:
    CVar6 = QNetworkProxy::capabilities(&this->networkProxy);
    CVar7 = QNetworkProxy::capabilities(&this->channels->proxy);
    errorCode = ProxyNotFoundError;
    if ((((uint)CVar7.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                super_QFlagsStorage<QNetworkProxy::Capability>.i |
         (uint)CVar6.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
               super_QFlagsStorage<QNetworkProxy::Capability>.i) & 0x10) == 0) {
      errorCode = HostNotFoundError;
    }
    bVar4 = dequeueRequest(this,this->channels->socket);
    if (bVar4) {
      emitReplyError(this,this->channels->socket,this->channels->reply,errorCode);
      this->networkLayerState = Unknown;
    }
    else if (this->connectionType - ConnectionTypeHTTP2 < 2) {
      pQVar1 = (this->channels->h2RequestsToSend).d.d.ptr;
      if (pQVar1 == (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                     *)0x0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var8 = *(_Base_ptr *)
                  ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      p_Var11 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                     *)0x0) {
        p_Var11 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var8 != p_Var11; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        emitReplyError(this,this->channels->socket,(QHttpNetworkReply *)p_Var8[1]._M_right,errorCode
                      );
      }
    }
    else {
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      uStack_44 = 0;
      local_40 = "default";
      QMessageLogger::debug
                ((char *)&local_58,
                 "QHttpNetworkConnectionPrivate::_q_hostLookupFinished could not de-queue request, failed to report HostNotFoundError"
                );
      this->networkLayerState = Unknown;
    }
  }
  else {
    lVar10 = local_78.size << 3;
    bVar9 = false;
    bVar2 = false;
    bVar4 = false;
    this_00 = local_78.ptr;
    do {
      NVar5 = QHostAddress::protocol(this_00);
      if (NVar5 == IPv6Protocol) {
        bVar3 = true;
        bVar2 = true;
        if (!bVar4) goto LAB_002020a9;
      }
      else if ((NVar5 == IPv4Protocol) && (bVar9 = true, !bVar4)) {
        bVar3 = false;
LAB_002020a9:
        this->delayIpv4 = bVar3;
        bVar4 = true;
      }
      this_00 = this_00 + 1;
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
    if (bVar9) {
      if (bVar2) {
        startNetworkLayerStateLookup(this);
        goto LAB_00202232;
      }
      this->networkLayerState = IPv4;
    }
    else {
      if (!bVar2) goto LAB_002020eb;
      this->networkLayerState = IPv6;
    }
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = 0;
    uStack_44 = 0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)&this->field_0x8,"_q_startNextRequest",QueuedConnection,1,
               (void **)&local_58,(char **)&uStack_50,(QMetaTypeInterface **)&local_48);
  }
LAB_00202232:
  QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_78);
LAB_0020223c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::_q_hostLookupFinished(const QHostInfo &info)
{
    bool bIpv4 = false;
    bool bIpv6 = false;
    bool foundAddress = false;
    if (networkLayerState == IPv4 || networkLayerState == IPv6 || networkLayerState == IPv4or6)
        return;

    const auto addresses = info.addresses();
    for (const QHostAddress &address : addresses) {
        const QAbstractSocket::NetworkLayerProtocol protocol = address.protocol();
        if (protocol == QAbstractSocket::IPv4Protocol) {
            if (!foundAddress) {
                foundAddress = true;
                delayIpv4 = false;
            }
            bIpv4 = true;
        } else if (protocol == QAbstractSocket::IPv6Protocol) {
            if (!foundAddress) {
                foundAddress = true;
                delayIpv4 = true;
            }
            bIpv6 = true;
        }
    }

    if (bIpv4 && bIpv6)
        startNetworkLayerStateLookup();
    else if (bIpv4) {
        networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
        QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
    } else if (bIpv6) {
        networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        auto lookupError = QNetworkReply::HostNotFoundError;
#ifndef QT_NO_NETWORKPROXY
        // if the proxy can lookup hostnames, all hostname lookups except for the lookup of the
        // proxy hostname are delegated to the proxy.
        auto proxyCapabilities = networkProxy.capabilities() | channels[0].proxy.capabilities();
        if (proxyCapabilities & QNetworkProxy::HostNameLookupCapability)
            lookupError = QNetworkReply::ProxyNotFoundError;
#endif
        if (dequeueRequest(channels[0].socket)) {
            emitReplyError(channels[0].socket, channels[0].reply, lookupError);
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        } else if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2
                   || connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
            for (const HttpMessagePair &h2Pair : std::as_const(channels[0].h2RequestsToSend)) {
                // emit error for all replies
                QHttpNetworkReply *currentReply = h2Pair.second;
                Q_ASSERT(currentReply);
                emitReplyError(channels[0].socket, currentReply, lookupError);
            }
        } else {
            // We can end up here if a request has been aborted or otherwise failed (e.g. timeout)
            // before the host lookup was finished.
            qDebug("QHttpNetworkConnectionPrivate::_q_hostLookupFinished"
                   " could not de-queue request, failed to report HostNotFoundError");
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        }
    }
}